

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

Own<capnp::ClientHook,_std::nullptr_t> __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::handleProvide(capnp::rpc::Provide::Reader_const&)::
ProvidePipelineHook::getPipelinedCap(kj::Array<capnp::PipelineOp>___
          (void *this,Array<capnp::PipelineOp> *ops)

{
  char *pcVar1;
  size_t sVar2;
  char (*in_RCX) [38];
  ClientHook *extraout_RDX;
  ClientHook *extraout_RDX_00;
  ClientHook *pCVar3;
  Own<capnp::ClientHook,_std::nullptr_t> OVar4;
  String local_1c8;
  Exception local_1a8;
  
  kj::_::Debug::makeDescription<char_const(&)[38]>
            (&local_1c8,(Debug *)"\"can\'t pipeline on a Provide operation\"",
             "can\'t pipeline on a Provide operation",in_RCX);
  kj::Exception::Exception
            (&local_1a8,FAILED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
             ,0x1144,&local_1c8);
  newBrokenCap((capnp *)this,&local_1a8);
  kj::Exception::~Exception(&local_1a8);
  sVar2 = local_1c8.content.size_;
  pcVar1 = local_1c8.content.ptr;
  pCVar3 = extraout_RDX;
  if (local_1c8.content.ptr != (char *)0x0) {
    local_1c8.content.ptr = (char *)0x0;
    local_1c8.content.size_ = 0;
    (**(local_1c8.content.disposer)->_vptr_ArrayDisposer)
              (local_1c8.content.disposer,pcVar1,1,sVar2,sVar2,0);
    pCVar3 = extraout_RDX_00;
  }
  OVar4.ptr = pCVar3;
  OVar4.disposer = (Disposer *)this;
  return OVar4;
}

Assistant:

kj::Own<ClientHook> getPipelinedCap(kj::Array<PipelineOp>&& ops) override {
        return newBrokenCap(KJ_EXCEPTION(FAILED, "can't pipeline on a Provide operation"));
      }